

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaNf.c
# Opt level: O0

void Nf_ManCutMatchOne(Nf_Man_t *p,int iObj,int *pCut,int *pCutSet)

{
  Vec_Wec_t *p_00;
  long lVar1;
  long lVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  Nf_Cfg_t NVar7;
  uint c_00;
  uint uVar8;
  Nf_Obj_t *pNVar9;
  int *piVar10;
  Vec_Int_t *p_01;
  Nf_Obj_t *pNVar11;
  Nf_Mat_t *pNVar12;
  Nf_Mat_t *pNVar13;
  Mio_Cell2_t *pMVar14;
  word wVar15;
  Nf_Mat_t (*paNVar16) [2];
  word local_110;
  word Delay;
  word Area;
  Nf_Mat_t *pA_1;
  Nf_Mat_t *pD_1;
  word Required;
  int fCompl;
  Mio_Cell2_t *pC;
  Nf_Cfg_t Cfg;
  int Const;
  Nf_Obj_t *pBestF [6];
  Nf_Mat_t *pA;
  Nf_Mat_t *pD;
  word ArrivalA;
  word ArrivalD;
  int fComplF;
  int iFanin;
  int Offset;
  int Info;
  int c;
  int k;
  int i;
  Vec_Int_t *vArr;
  int fComplExt;
  int iFuncLit;
  int nFans;
  int *pFans;
  Nf_Obj_t *pBest;
  int *pCutSet_local;
  int *pCut_local;
  int iObj_local;
  Nf_Man_t *p_local;
  
  pNVar9 = Nf_ManObj(p,iObj);
  piVar10 = Nf_CutLeaves(pCut);
  uVar3 = Nf_CutSize(pCut);
  iVar4 = Nf_CutFunc(pCut);
  uVar5 = Abc_LitIsCompl(iVar4);
  p_00 = p->vTt2Match;
  iVar6 = Abc_Lit2Var(iVar4);
  p_01 = Vec_WecEntry(p_00,iVar6);
  for (c = 0; c < (int)uVar3; c = c + 1) {
    pNVar11 = Nf_ManObj(p,piVar10[c]);
    *(Nf_Obj_t **)(&stack0xffffffffffffff38 + (long)c * 8) = pNVar11;
  }
  if (uVar3 == 0) {
    if ((iVar4 != 0) && (iVar4 != 1)) {
      __assert_fail("iFuncLit == 0 || iFuncLit == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaNf.c"
                    ,0x461,"void Nf_ManCutMatchOne(Nf_Man_t *, int, int *, int *)");
    }
    for (Offset = 0; Offset < 2; Offset = Offset + 1) {
      pNVar12 = Nf_ObjMatchD(p,iObj,Offset);
      pNVar13 = Nf_ObjMatchA(p,iObj,Offset);
      pNVar13->D = 0;
      pNVar12->D = 0;
      wVar15 = p->pCells[(int)(Offset ^ (uint)(iVar4 == 1))].Area;
      pNVar13->A = wVar15;
      pNVar12->A = wVar15;
      uVar3 = Nf_CutHandle(pCutSet,pCut);
      *(uint *)pNVar13 = *(uint *)pNVar13 & 0xc00fffff | (uVar3 & 0x3ff) << 0x14;
      *(uint *)pNVar12 = *(uint *)pNVar12 & 0xc00fffff | (uVar3 & 0x3ff) << 0x14;
      uVar3 = (Offset ^ (uint)(iVar4 == 1)) & 0xfffff;
      *(uint *)pNVar13 = *(uint *)pNVar13 & 0xfff00000 | uVar3;
      *(uint *)pNVar12 = *(uint *)pNVar12 & 0xfff00000 | uVar3;
      NVar7 = Nf_Int2Cfg(0);
      pNVar13->Cfg = NVar7;
      pNVar12->Cfg = pNVar13->Cfg;
    }
  }
  else {
    for (c = 0; iVar4 = Vec_IntSize(p_01), c + 1 < iVar4; c = c + 2) {
      iVar4 = Vec_IntEntry(p_01,c);
      iVar6 = Vec_IntEntry(p_01,c + 1);
      NVar7 = Nf_Int2Cfg(iVar6);
      pMVar14 = Nf_ManCell(p,iVar4);
      c_00 = (uint)NVar7 & 1 ^ uVar5;
      wVar15 = Nf_ObjRequired(p,iObj,c_00);
      paNVar16 = pNVar9->M + (int)c_00;
      pNVar12 = pNVar9->M[(int)c_00] + 1;
      Delay = pMVar14->Area;
      local_110 = 0;
      if (uVar3 != *(uint *)&pMVar14->field_0x10 >> 0x1c) {
        __assert_fail("nFans == (int)pC->nFanins",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaNf.c"
                      ,0x479,"void Nf_ManCutMatchOne(Nf_Man_t *, int, int *, int *)");
      }
      for (Info = 0; Info < (int)uVar3; Info = Info + 1) {
        iVar4 = Nf_CfgVar(NVar7,Info);
        iVar6 = Nf_CfgCompl(NVar7,Info);
        lVar1 = *(long *)(*(long *)(&stack0xffffffffffffff38 + (long)iVar4 * 8) + (long)iVar6 * 0x30
                         + 8);
        lVar2 = *(long *)(*(long *)(&stack0xffffffffffffff38 + (long)iVar4 * 8) + (long)iVar6 * 0x30
                         + 0x20);
        if ((wVar15 < lVar2 + pMVar14->Delays[Info]) || (wVar15 == 0xffffffffffffffff)) {
          if (((*paNVar16)[0].D != 0xffffffffffffffff) &&
             ((pNVar9->M[(int)c_00][1].D != 0xffffffffffffffff &&
              (wVar15 < lVar1 + pMVar14->Delays[Info])))) break;
          local_110 = Abc_MaxWord(local_110,lVar1 + pMVar14->Delays[Info]);
          lVar1 = *(long *)(*(long *)(&stack0xffffffffffffff38 + (long)iVar4 * 8) +
                            (long)iVar6 * 0x30 + 0x10);
        }
        else {
          local_110 = Abc_MaxWord(local_110,lVar2 + pMVar14->Delays[Info]);
          lVar1 = *(long *)(*(long *)(&stack0xffffffffffffff38 + (long)iVar4 * 8) +
                            (long)iVar6 * 0x30 + 0x28);
        }
        Delay = lVar1 + Delay;
      }
      if ((int)uVar3 <= Info) {
        if (local_110 < (*paNVar16)[0].D) {
          (*paNVar16)[0].D = local_110;
          (*paNVar16)[0].A = Delay;
          uVar8 = Nf_CutHandle(pCutSet,pCut);
          *(uint *)*paNVar16 = *(uint *)*paNVar16 & 0xc00fffff | (uVar8 & 0x3ff) << 0x14;
          *(uint *)*paNVar16 =
               *(uint *)*paNVar16 & 0xfff00000 | *(uint *)&pMVar14->field_0x10 & 0xfffff;
          (*paNVar16)[0].Cfg = NVar7;
          (*paNVar16)[0].Cfg = (Nf_Cfg_t)((uint)(*paNVar16)[0].Cfg & 0xfffffffe);
        }
        if (Delay < pNVar9->M[(int)c_00][1].A) {
          pNVar9->M[(int)c_00][1].D = local_110;
          pNVar9->M[(int)c_00][1].A = Delay;
          uVar8 = Nf_CutHandle(pCutSet,pCut);
          *(uint *)pNVar12 = *(uint *)pNVar12 & 0xc00fffff | (uVar8 & 0x3ff) << 0x14;
          *(uint *)pNVar12 = *(uint *)pNVar12 & 0xfff00000 | *(uint *)&pMVar14->field_0x10 & 0xfffff
          ;
          pNVar9->M[(int)c_00][1].Cfg = NVar7;
          pNVar9->M[(int)c_00][1].Cfg = (Nf_Cfg_t)((uint)pNVar9->M[(int)c_00][1].Cfg & 0xfffffffe);
        }
      }
    }
  }
  return;
}

Assistant:

void Nf_ManCutMatchOne( Nf_Man_t * p, int iObj, int * pCut, int * pCutSet )
{
    Nf_Obj_t * pBest = Nf_ManObj(p, iObj);
    int * pFans      = Nf_CutLeaves(pCut);
    int nFans        = Nf_CutSize(pCut);
    int iFuncLit     = Nf_CutFunc(pCut);
    int fComplExt    = Abc_LitIsCompl(iFuncLit);
    Vec_Int_t * vArr = Vec_WecEntry( p->vTt2Match, Abc_Lit2Var(iFuncLit) );
    int i, k, c, Info, Offset, iFanin, fComplF;
    word ArrivalD, ArrivalA;
    Nf_Mat_t * pD, * pA;
    // assign fanins matches
    Nf_Obj_t * pBestF[NF_LEAF_MAX];
    for ( i = 0; i < nFans; i++ )
        pBestF[i] = Nf_ManObj( p, pFans[i] );
    // special cases
    if ( nFans == 0 )
    {
        int Const = (iFuncLit == 1);
        assert( iFuncLit == 0 || iFuncLit == 1 );
        for ( c = 0; c < 2; c++ )
        { 
            pD = Nf_ObjMatchD( p, iObj, c );
            pA = Nf_ObjMatchA( p, iObj, c );
            pD->D = pA->D = 0;
            pD->A = pA->A = p->pCells[c ^ Const].Area;
            pD->CutH = pA->CutH = Nf_CutHandle(pCutSet, pCut);
            pD->Gate = pA->Gate = c ^ Const;
//            pD->Conf = pA->Conf = 0;
            pD->Cfg = pA->Cfg = Nf_Int2Cfg(0);
        }
        return;
    }
    // consider matches of this function
    Vec_IntForEachEntryDouble( vArr, Info, Offset, i )
    {
        Nf_Cfg_t Cfg   = Nf_Int2Cfg(Offset);
        Mio_Cell2_t*pC = Nf_ManCell( p, Info );
        int fCompl     = Cfg.fCompl ^ fComplExt;
        word Required  = Nf_ObjRequired( p, iObj, fCompl );
        Nf_Mat_t * pD  = &pBest->M[fCompl][0];
        Nf_Mat_t * pA  = &pBest->M[fCompl][1];
        word Area      = pC->Area, Delay = 0;
        assert( nFans == (int)pC->nFanins );
        Nf_CfgForEachVarCompl( Cfg, nFans, iFanin, fComplF, k )
        {
            ArrivalD  = pBestF[iFanin]->M[fComplF][0].D;
            ArrivalA  = pBestF[iFanin]->M[fComplF][1].D;
            if ( ArrivalA + pC->Delays[k] <= Required && Required != NF_INFINITY )
            {
                Delay = Abc_MaxWord( Delay, ArrivalA + pC->Delays[k] );
                Area += pBestF[iFanin]->M[fComplF][1].A;
            }
            else 
            {
                if ( pD->D < NF_INFINITY && pA->D < NF_INFINITY && ArrivalD + pC->Delays[k] > Required )
                    break;
                Delay = Abc_MaxWord( Delay, ArrivalD + pC->Delays[k] );
                Area += pBestF[iFanin]->M[fComplF][0].A;
            }
        }
        if ( k < nFans )
            continue;
        // select best Cfgch
        if ( pD->D > Delay )
        {
            pD->D = Delay;
            pD->A = Area;
            pD->CutH = Nf_CutHandle(pCutSet, pCut);
            pD->Gate = pC->Id;
            pD->Cfg = Cfg;
            pD->Cfg.fCompl = 0;
        }

        if ( pA->A > Area )
        {
            pA->D = Delay;
            pA->A = Area;
            pA->CutH = Nf_CutHandle(pCutSet, pCut);
            pA->Gate = pC->Id;
            pA->Cfg = Cfg;
            pA->Cfg.fCompl = 0;
        }
    }
}